

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.h
# Opt level: O1

Id __thiscall spv::Builder::getImageType(Builder *this,Id resultId)

{
  Op OVar1;
  pointer ppIVar2;
  Instruction *pIVar3;
  uint uVar4;
  
  ppIVar2 = (this->module).idToInstruction.
            super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  pIVar3 = ppIVar2[resultId];
  if (pIVar3 == (Instruction *)0x0) {
    uVar4 = 0;
  }
  else {
    uVar4 = pIVar3->typeId;
  }
  OVar1 = ppIVar2[uVar4]->opCode;
  if (OVar1 != OpTypeImage) {
    if (OVar1 != OpTypeSampledImage) {
      __assert_fail("isImageType(typeId) || isSampledImageType(typeId)",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.h"
                    ,0x172,"Id spv::Builder::getImageType(Id) const");
    }
    pIVar3 = (this->module).idToInstruction.
             super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
             super__Vector_impl_data._M_start[uVar4];
    if ((**(byte **)&(pIVar3->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data & 1) == 0) {
      __assert_fail("idOperand[op]",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/spvIR.h"
                    ,0xa1,"Id spv::Instruction::getIdOperand(int) const");
    }
    uVar4 = *(pIVar3->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
  }
  return uVar4;
}

Assistant:

Id getImageType(Id resultId) const
    {
        Id typeId = getTypeId(resultId);
        assert(isImageType(typeId) || isSampledImageType(typeId));
        return isSampledImageType(typeId) ? module.getInstruction(typeId)->getIdOperand(0) : typeId;
    }